

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrPlaneDetectorLocationEXT *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  bool bVar4;
  NextChainResult NVar5;
  pointer pcVar6;
  long lVar7;
  XrResult XVar8;
  string out;
  string local_298;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_258;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_240;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  string error_message;
  ios_base local_170 [264];
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  
  XVar8 = XR_SUCCESS;
  if (value->type != XR_TYPE_PLANE_DETECTOR_LOCATION_EXT) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrPlaneDetectorLocationEXT",value->type,
               "VUID-XrPlaneDetectorLocationEXT-type-type",XR_TYPE_PLANE_DETECTOR_LOCATION_EXT,
               "XR_TYPE_PLANE_DETECTOR_LOCATION_EXT");
    XVar8 = XR_ERROR_VALIDATION_FAILURE;
  }
  if (!check_pnext) goto LAB_00204202;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  NVar5 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar5 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ","");
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&out,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
    paVar1 = &out.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,"VUID-XrPlaneDetectorLocationEXT-next-unique","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_210,objects_info);
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_298,
               "Multiple structures of the same type(s) in \"next\" chain for XrPlaneDetectorLocationEXT struct"
               ,"");
    CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_210,
                        &local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
    if (local_210.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_210.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_210.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_210.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_message._M_dataplus._M_p != &error_message.field_2) {
LAB_002041d5:
      operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1
                     );
    }
LAB_002041e5:
    XVar8 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar5 == NEXT_CHAIN_RESULT_ERROR) {
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,"VUID-XrPlaneDetectorLocationEXT-next-next","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1f8,objects_info);
    out._M_dataplus._M_p = (pointer)&out.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,
               "Invalid structure(s) in \"next\" chain for XrPlaneDetectorLocationEXT struct \"next\""
               ,"");
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_1f8,&out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != &out.field_2) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_message._M_dataplus._M_p != &error_message.field_2) goto LAB_002041d5;
    goto LAB_002041e5;
  }
  if (duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(duplicate_ext_structs.
                    super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)duplicate_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)duplicate_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_00204202:
  if (check_members && XVar8 == XR_SUCCESS) {
    if (value->locationFlags < 0x10) {
      paVar2 = &error_message.field_2;
      error_message._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&error_message,"XrPlaneDetectorLocationEXT","");
      paVar1 = &out.field_2;
      out._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&out,"orientation","");
      bVar4 = ValidateXrEnum(instance_info,command_name,&error_message,&out,objects_info,
                             value->orientation);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar1) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error_message._M_dataplus._M_p != paVar2) {
        operator_delete(error_message._M_dataplus._M_p,
                        error_message.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        error_message._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&error_message,"XrPlaneDetectorLocationEXT","");
        out._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&out,"semanticType","");
        bVar4 = ValidateXrEnum(instance_info,command_name,&error_message,&out,objects_info,
                               value->semanticType);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out._M_dataplus._M_p != paVar1) {
          operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)error_message._M_dataplus._M_p != paVar2) {
          operator_delete(error_message._M_dataplus._M_p,
                          error_message.field_2._M_allocated_capacity + 1);
        }
        if (bVar4) {
          return XR_SUCCESS;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&error_message,
                   "XrPlaneDetectorLocationEXT contains invalid XrPlaneDetectorSemanticTypeEXT \"semanticType\" enum value "
                   ,0x65);
        local_298._M_dataplus._M_p._0_4_ = value->semanticType;
        out._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&out,'\n');
        *out._M_dataplus._M_p = '0';
        out._M_dataplus._M_p[1] = 'x';
        pcVar6 = out._M_dataplus._M_p + (out._M_string_length - 1);
        lVar7 = 0;
        do {
          bVar3 = *(byte *)((long)&local_298._M_dataplus._M_p + lVar7);
          *pcVar6 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 & 0xf];
          pcVar6[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 >> 4];
          lVar7 = lVar7 + 1;
          pcVar6 = pcVar6 + -2;
        } while (lVar7 != 4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&error_message,out._M_dataplus._M_p,out._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out._M_dataplus._M_p != paVar1) {
          operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
        }
        out._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&out,"VUID-XrPlaneDetectorLocationEXT-semanticType-parameter","");
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_258,objects_info);
        std::__cxx11::stringbuf::str();
        CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            &local_258,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if (local_258.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_258.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_258.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_258.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out._M_dataplus._M_p != paVar1) {
          operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&error_message,
                   "XrPlaneDetectorLocationEXT contains invalid XrPlaneDetectorOrientationEXT \"orientation\" enum value "
                   ,99);
        local_298._M_dataplus._M_p._0_4_ = value->orientation;
        out._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&out,'\n');
        *out._M_dataplus._M_p = '0';
        out._M_dataplus._M_p[1] = 'x';
        pcVar6 = out._M_dataplus._M_p + (out._M_string_length - 1);
        lVar7 = 0;
        do {
          bVar3 = *(byte *)((long)&local_298._M_dataplus._M_p + lVar7);
          *pcVar6 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 & 0xf];
          pcVar6[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 >> 4];
          lVar7 = lVar7 + 1;
          pcVar6 = pcVar6 + -2;
        } while (lVar7 != 4);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&error_message,out._M_dataplus._M_p,out._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out._M_dataplus._M_p != paVar1) {
          operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
        }
        out._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&out,"VUID-XrPlaneDetectorLocationEXT-orientation-parameter","");
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_240,objects_info);
        std::__cxx11::stringbuf::str();
        CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            &local_240,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if (local_240.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_240.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_240.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_240.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out._M_dataplus._M_p != paVar1) {
          operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&error_message,
                 "XrPlaneDetectorLocationEXT invalid member XrSpaceLocationFlags \"locationFlags\" flag value "
                 ,0x5a);
      local_298._M_dataplus._M_p._0_4_ = (int)value->locationFlags;
      paVar1 = &out.field_2;
      out._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&out,'\n');
      *out._M_dataplus._M_p = '0';
      out._M_dataplus._M_p[1] = 'x';
      pcVar6 = out._M_dataplus._M_p + (out._M_string_length - 1);
      lVar7 = 0;
      do {
        bVar3 = *(byte *)((long)&local_298._M_dataplus._M_p + lVar7);
        *pcVar6 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 & 0xf];
        pcVar6[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar3 >> 4];
        lVar7 = lVar7 + 1;
        pcVar6 = pcVar6 + -2;
      } while (lVar7 != 4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&error_message,out._M_dataplus._M_p,out._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar1) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&error_message," contains illegal bit",0x15);
      out._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&out,"VUID-XrPlaneDetectorLocationEXT-locationFlags-parameter","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_228,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          &local_228,&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_228.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar1) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
    std::ios_base::~ios_base(local_170);
    XVar8 = XR_ERROR_VALIDATION_FAILURE;
  }
  return XVar8;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrPlaneDetectorLocationEXT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_PLANE_DETECTOR_LOCATION_EXT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrPlaneDetectorLocationEXT",
                             value->type, "VUID-XrPlaneDetectorLocationEXT-type-type", XR_TYPE_PLANE_DETECTOR_LOCATION_EXT, "XR_TYPE_PLANE_DETECTOR_LOCATION_EXT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorLocationEXT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrPlaneDetectorLocationEXT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrPlaneDetectorLocationEXT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorLocationEXT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrPlaneDetectorLocationEXT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    ValidateXrFlagsResult space_location_flags_result = ValidateXrSpaceLocationFlags(value->locationFlags);
    // Valid flags available, so it must be invalid to fail.
    if (VALIDATE_XR_FLAGS_INVALID == space_location_flags_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrPlaneDetectorLocationEXT invalid member XrSpaceLocationFlags \"locationFlags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->locationFlags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorLocationEXT-locationFlags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrPlaneDetectorOrientationEXT value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrPlaneDetectorLocationEXT", "orientation", objects_info, value->orientation)) {
        std::ostringstream oss_enum;
        oss_enum << "XrPlaneDetectorLocationEXT contains invalid XrPlaneDetectorOrientationEXT \"orientation\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->orientation));
        CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorLocationEXT-orientation-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrPlaneDetectorSemanticTypeEXT value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrPlaneDetectorLocationEXT", "semanticType", objects_info, value->semanticType)) {
        std::ostringstream oss_enum;
        oss_enum << "XrPlaneDetectorLocationEXT contains invalid XrPlaneDetectorSemanticTypeEXT \"semanticType\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->semanticType));
        CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorLocationEXT-semanticType-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}